

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

int row_mt_worker_hook(void *arg1,void *arg2)

{
  AV1_COMMON *cm_00;
  TileInfo *tile;
  long lVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ThreadData *td;
  int *piVar7;
  TileDataDec *tile_data;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  DecoderCodingBlock *pDVar11;
  DecoderCodingBlock *pDVar12;
  MACROBLOCKD *pMVar13;
  ENTROPY_CONTEXT (*paEVar14) [32];
  byte bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  TileJobsDec *pTVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  size_t __n;
  long lVar28;
  uint uVar29;
  long lVar30;
  char cVar31;
  int iVar32;
  ulong uVar33;
  void *__src;
  long lVar34;
  int iVar35;
  pthread_mutex_t *ppVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long *plVar40;
  long lVar41;
  qm_val_t *(*__dest) [19];
  long lVar42;
  bool bVar43;
  AV1_COMMON *cm;
  
  td = *arg1;
  (td->dcb).corrupted = 0;
  iVar16 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xe8));
  if (iVar16 == 0) {
    *(undefined4 *)((long)arg1 + 0xe0) = 1;
    if (*(int *)((long)arg2 + 0x9e44) == 0) {
      bVar15 = *(byte *)((long)arg2 + 0x3d4c) ^ 1;
    }
    else {
      bVar15 = 0;
    }
    piVar7 = &(td->dcb).corrupted;
    cm_00 = (AV1_COMMON *)((long)arg2 + 0x3b60);
    td->predict_and_recon_intra_block_visit = decode_block_void;
    td->inverse_tx_inter_block_visit = decode_block_void;
    td->predict_inter_block_visit = predict_inter_block_void;
    td->cfl_store_inter_block_visit = cfl_store_inter_block_void;
    td->read_coeffs_tx_intra_block_visit = read_coeffs_tx_intra_block;
    td->read_coeffs_tx_inter_block_visit = av1_read_coeffs_txb;
    pDVar11 = &td->dcb;
    do {
      if ((*piVar7 != 0) ||
         (pTVar24 = get_dec_job_info((AV1DecTileMT *)((long)arg2 + 0x58d30)),
         pTVar24 == (TileJobsDec *)0x0)) break;
      tile_data = pTVar24->tile_data;
      tile_worker_hook_init
                ((AV1Decoder *)arg2,(DecWorkerData *)arg1,pTVar24->tile_buffer,tile_data,bVar15);
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      piVar2 = &(tile_data->dec_row_mt_sync).num_threads_working;
      *piVar2 = *piVar2 + 1;
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      lVar30 = *(long *)((long)arg2 + 0x9be8);
      bVar3 = *(byte *)(lVar30 + 0x1c);
      cVar31 = *(char *)(lVar30 + 0x4d);
      lVar41 = (long)(tile_data->tile_info).tile_row;
      iVar16 = (tile_data->tile_info).mi_col_start;
      lVar39 = (long)iVar16;
      uVar33 = -1L << (*(byte *)(lVar30 + 0x24) & 0x3f);
      bVar4 = *(byte *)(lVar30 + 0x60);
      uVar33 = (long)(int)(~(uint)uVar33 + ((tile_data->tile_info).mi_col_end - iVar16)) & uVar33;
      memset((void *)(*(long *)(*(long *)((long)arg2 + 0x9e60) + lVar41 * 8) + lVar39),0,uVar33);
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar3];
      bVar43 = cVar31 == '\0';
      if (bVar43) {
        lVar30 = *(long *)(*(long *)((long)arg2 + 0x9e68) + lVar41 * 8);
        if ((lVar30 == 0) || (*(long *)(*(long *)((long)arg2 + 0x9e70) + lVar41 * 8) == 0)) {
          aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                             "Invalid value of planes");
        }
        else {
          lVar42 = (long)(iVar16 >> (bVar4 & 0x1f));
          __n = (size_t)((int)uVar33 >> (bVar4 & 0x1f));
          memset((void *)(lVar30 + lVar42),0,__n);
          memset((void *)(lVar42 + *(long *)(*(long *)((long)arg2 + 0x9e70) + lVar41 * 8)),0,__n);
        }
      }
      uVar18 = (uint)bVar43 * 2 + 1;
      memset((void *)(*(long *)(*(long *)((long)arg2 + 0x9e58) + lVar41 * 8) + lVar39),0,uVar33);
      memset((void *)(lVar39 + *(long *)(*(long *)((long)arg2 + 0x9e78) + lVar41 * 8)),0x40,uVar33);
      av1_reset_loop_filter_delta((MACROBLOCKD *)td,uVar18);
      av1_reset_loop_restoration((MACROBLOCKD *)td,uVar18);
      iVar16 = (tile_data->tile_info).mi_row_start;
      if (iVar16 < (tile_data->tile_info).mi_row_end) {
        do {
          paEVar14 = (td->dcb).xd.left_entropy_context;
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x10) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x11) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x12) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x13) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x14) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x15) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x16) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x17) = '\0';
          paEVar14 = (td->dcb).xd.left_entropy_context;
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x18) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x19) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1a) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1b) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1c) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1d) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1e) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1f) = '\0';
          pMVar13 = &(td->dcb).xd;
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 0) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 1) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 2) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 3) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 4) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 5) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 6) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 7) = '\0';
          paEVar14 = (td->dcb).xd.left_entropy_context;
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 8) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 9) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 10) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xb) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xc) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xd) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xe) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xf) = '\0';
          paEVar14 = (td->dcb).xd.left_entropy_context;
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x10) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x11) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x12) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x13) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x14) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x15) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x16) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x17) = '\0';
          paEVar14 = (td->dcb).xd.left_entropy_context;
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x18) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x19) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1a) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1b) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1c) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1d) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1e) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1f) = '\0';
          pMVar13 = &(td->dcb).xd;
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 0) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 1) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 2) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 3) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 4) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 5) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 6) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 7) = '\0';
          paEVar14 = (td->dcb).xd.left_entropy_context;
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 8) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 9) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 10) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xb) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xc) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xd) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xe) = '\0';
          *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xf) = '\0';
          pMVar13 = &(td->dcb).xd;
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x10) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x11) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x12) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x13) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x14) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x15) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x16) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x17) = '\0';
          pMVar13 = &(td->dcb).xd;
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x18) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x19) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1a) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1b) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1c) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1d) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1e) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1f) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 0) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 1) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 2) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 3) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 4) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 5) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 6) = '\0';
          *(ENTROPY_CONTEXT *)((long)((pDVar11->xd).left_entropy_context + 0) + 7) = '\0';
          pMVar13 = &(td->dcb).xd;
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 8) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 9) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 10) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xb) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xc) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xd) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xe) = '\0';
          *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xf) = '\0';
          pDVar12 = &td->dcb;
          (pDVar12->xd).left_partition_context[0x10] = '\0';
          (pDVar12->xd).left_partition_context[0x11] = '\0';
          (pDVar12->xd).left_partition_context[0x12] = '\0';
          (pDVar12->xd).left_partition_context[0x13] = '\0';
          (pDVar12->xd).left_partition_context[0x14] = '\0';
          (pDVar12->xd).left_partition_context[0x15] = '\0';
          (pDVar12->xd).left_partition_context[0x16] = '\0';
          (pDVar12->xd).left_partition_context[0x17] = '\0';
          pDVar12 = &td->dcb;
          (pDVar12->xd).left_partition_context[0x18] = '\0';
          (pDVar12->xd).left_partition_context[0x19] = '\0';
          (pDVar12->xd).left_partition_context[0x1a] = '\0';
          (pDVar12->xd).left_partition_context[0x1b] = '\0';
          (pDVar12->xd).left_partition_context[0x1c] = '\0';
          (pDVar12->xd).left_partition_context[0x1d] = '\0';
          (pDVar12->xd).left_partition_context[0x1e] = '\0';
          (pDVar12->xd).left_partition_context[0x1f] = '\0';
          (td->dcb).xd.left_partition_context[0] = '\0';
          (td->dcb).xd.left_partition_context[1] = '\0';
          (td->dcb).xd.left_partition_context[2] = '\0';
          (td->dcb).xd.left_partition_context[3] = '\0';
          (td->dcb).xd.left_partition_context[4] = '\0';
          (td->dcb).xd.left_partition_context[5] = '\0';
          (td->dcb).xd.left_partition_context[6] = '\0';
          (td->dcb).xd.left_partition_context[7] = '\0';
          pDVar12 = &td->dcb;
          (pDVar12->xd).left_partition_context[8] = '\0';
          (pDVar12->xd).left_partition_context[9] = '\0';
          (pDVar12->xd).left_partition_context[10] = '\0';
          (pDVar12->xd).left_partition_context[0xb] = '\0';
          (pDVar12->xd).left_partition_context[0xc] = '\0';
          (pDVar12->xd).left_partition_context[0xd] = '\0';
          (pDVar12->xd).left_partition_context[0xe] = '\0';
          (pDVar12->xd).left_partition_context[0xf] = '\0';
          builtin_memcpy((td->dcb).xd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",
                         0x20);
          iVar25 = (tile_data->tile_info).mi_col_start;
          if (iVar25 < (tile_data->tile_info).mi_col_end) {
            do {
              bVar4 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24);
              lVar39 = (long)((iVar25 >> (bVar4 & 0x1f)) +
                             (iVar16 >> (bVar4 & 0x1f)) *
                             ((*(int *)((long)arg2 + 0x3d78) >> (bVar4 & 0x1f)) + 1)) * 0x3b000;
              lVar30 = *(long *)((long)arg2 + 0x5f6d0) + lVar39;
              lVar41 = *(long *)((long)arg2 + 0x5f6d0) + lVar39 + 0x30000;
              lVar42 = 0x1d90;
              lVar39 = lVar30;
              do {
                *(long *)((long)td + lVar42 * 8 + -0xb198) = lVar39;
                *(long *)((long)td + lVar42 * 8 + -0xb178) = lVar41;
                *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -3) + lVar42 * 2) = 0;
                *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -2) + lVar42 * 2) = 0;
                lVar26 = lVar42 - (ulong)uVar18;
                lVar42 = lVar42 + 1;
                lVar41 = lVar41 + 0x1000;
                lVar39 = lVar39 + 0x10000;
              } while (lVar26 != 0x1d8f);
              (td->dcb).xd.plane[0].color_index_map = (uint8_t *)(lVar30 + 0x33000);
              (td->dcb).xd.plane[1].color_index_map = (uint8_t *)(lVar30 + 0x37000);
              (td->dcb).xd.color_index_map_offset[0] = 0;
              (td->dcb).xd.color_index_map_offset[1] = 0;
              decode_partition((AV1Decoder *)arg2,td,iVar16,iVar25,td->bit_reader,
                               *(BLOCK_SIZE *)(*(long *)((long)arg2 + 0x9be8) + 0x1c),1);
              iVar19 = aom_reader_has_overflowed(td->bit_reader);
              if (iVar19 != 0) {
                uVar18 = 1;
                goto LAB_00172cc5;
              }
              iVar25 = iVar25 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20);
            } while (iVar25 < (tile_data->tile_info).mi_col_end);
          }
          pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
          piVar2 = &(tile_data->dec_row_mt_sync).mi_rows_parse_done;
          *piVar2 = *piVar2 + (uint)bVar3;
          *(int *)((long)arg2 + 0x5f70c) = *(int *)((long)arg2 + 0x5f70c) + (uint)bVar3;
          pthread_cond_signal(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
          pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
          iVar16 = iVar16 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20);
        } while (iVar16 < (tile_data->tile_info).mi_row_end);
      }
      iVar16 = check_trailing_bits_after_symbol_coder(td->bit_reader);
      uVar18 = (uint)(iVar16 != 0);
LAB_00172cc5:
      aom_merge_corrupted_flag(piVar7,uVar18);
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      piVar2 = &(tile_data->dec_row_mt_sync).num_threads_working;
      *piVar2 = *piVar2 + -1;
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    } while (pTVar24 != (TileJobsDec *)0x0);
    if (*piVar7 == 0) {
      td->read_coeffs_tx_intra_block_visit = decode_block_void;
      td->read_coeffs_tx_inter_block_visit = decode_block_void;
      td->predict_and_recon_intra_block_visit = predict_and_reconstruct_intra_block;
      td->inverse_tx_inter_block_visit = inverse_transform_inter_block;
      td->predict_inter_block_visit = predict_inter_block;
      td->cfl_store_inter_block_visit = cfl_store_inter_block;
      do {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        while( true ) {
          if (*(int *)((long)arg2 + 0x5f710) == *(int *)((long)arg2 + 0x5f708)) {
            iVar25 = 0;
            iVar16 = 0;
            cVar31 = '\0';
            bVar43 = true;
            iVar19 = 0;
          }
          else {
            iVar16 = 0;
            bVar43 = *(int *)((long)arg2 + 0x5f714) == 1;
            iVar25 = 0;
            iVar19 = iVar16;
            if ((bVar43) ||
               (iVar19 = 1, *(int *)((long)arg2 + 0x5f70c) == *(int *)((long)arg2 + 0x5f710))) {
              cVar31 = (char)iVar19;
              iVar19 = 0;
            }
            else {
              iVar16 = *(int *)((long)arg2 + 0x5f6f0);
              iVar22 = *(int *)((long)arg2 + 0x5f6f4);
              bVar15 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [*(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x1c)];
              iVar25 = -1;
              iVar19 = -1;
              if (iVar16 < iVar22) {
                iVar17 = *(int *)((long)arg2 + 0x5f6f8);
                iVar23 = *(int *)((long)arg2 + 0x5f6fc);
                iVar35 = *(int *)((long)arg2 + 0x5f700);
                iVar5 = *(int *)((long)arg2 + 0x5f704);
                iVar37 = 0;
                iVar19 = -1;
                iVar25 = -1;
                iVar20 = 0x7fffffff;
                do {
                  lVar30 = (long)iVar17 * 0x53a0;
                  iVar38 = iVar17;
                  iVar21 = iVar20;
                  if (iVar17 < iVar23) {
                    do {
                      iVar27 = *(int *)((long)arg2 + 0x9c00) * iVar16;
                      iVar32 = iVar27 + iVar38;
                      iVar20 = iVar21;
                      if ((iVar35 <= iVar32) && (iVar32 <= iVar5)) {
                        lVar39 = (long)iVar27 * 0x53a0 + *(long *)((long)arg2 + 0x48d20);
                        iVar27 = *(int *)(lVar30 + 0x5394 + lVar39);
                        iVar32 = *(int *)(lVar30 + 0x538c + lVar39);
                        if (0 < (*(int *)(lVar30 + 0x5390 + lVar39) - iVar27) * iVar32) {
                          iVar6 = *(int *)(lVar30 + 0x5398 + lVar39);
                          if (iVar6 < iVar21) {
                            iVar37 = 0;
                            iVar20 = iVar6;
                          }
                          if (((iVar6 <= iVar21) &&
                              (iVar32 = (*(int *)(lVar30 + 0x5388 + lVar39) - iVar27) * iVar32,
                              iVar37 < iVar32)) &&
                             (iVar21 = av1_get_sb_rows_in_tile(cm_00,(TileInfo *)(lVar39 + lVar30)),
                             iVar6 < (int)((iVar21 != 1) + 1))) {
                            iVar37 = iVar32;
                            iVar25 = iVar16;
                            iVar19 = iVar38;
                          }
                        }
                      }
                      iVar38 = iVar38 + 1;
                      lVar30 = lVar30 + 0x53a0;
                      iVar21 = iVar20;
                    } while (iVar23 != iVar38);
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 != iVar22);
              }
              if ((iVar25 == -1) || (iVar19 == -1)) {
                iVar25 = 0;
                iVar16 = 0;
                cVar31 = '\x01';
                iVar19 = iVar25;
              }
              else {
                lVar30 = (long)iVar25 * (long)*(int *)((long)arg2 + 0x9c00) * 0x53a0 +
                         *(long *)((long)arg2 + 0x48d20);
                lVar39 = (long)iVar19 * 0x53a0;
                iVar16 = *(int *)(lVar39 + 0x5394 + lVar30);
                piVar2 = (int *)(lVar39 + 0x5398 + lVar30);
                *piVar2 = *piVar2 + 1;
                *(uint *)(lVar39 + 0x5394 + lVar30) = iVar16 + (uint)bVar15;
                iVar22 = (uint)bVar15 + *(int *)((long)arg2 + 0x5f710);
                iVar16 = *(int *)(lVar39 + lVar30) + iVar16;
                *(int *)((long)arg2 + 0x5f710) = iVar22;
                if (iVar22 == *(int *)((long)arg2 + 0x5f708)) {
                  pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
                }
                cVar31 = '\0';
              }
            }
          }
          if (cVar31 == '\0') break;
          pthread_cond_wait(*(pthread_cond_t **)((long)arg2 + 0x5f6e8),
                            *(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        }
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        if (bVar43) {
          *(undefined4 *)((long)arg1 + 0xe0) = 0;
          return (uint)(*piVar7 == 0);
        }
        lVar30 = *(long *)((long)arg2 + 0x48d20);
        iVar22 = *(int *)((long)arg2 + 0x9c00);
        av1_tile_init(&(td->dcb).xd.tile,cm_00,iVar25,iVar19);
        cVar31 = *(char *)(*(long *)((long)arg2 + 0x9be8) + 0x4d);
        uVar33 = 0;
        __dest = (td->dcb).xd.plane[0].seg_iqmatrix;
        do {
          if (*(char *)((long)(__dest + -2) + 0x80) == '\0') {
            uVar8 = *(undefined8 *)((long)arg2 + 0x3de4);
            uVar9 = *(undefined8 *)((long)arg2 + 0x3dec);
            uVar10 = *(undefined8 *)((long)arg2 + 0x3dfc);
            *(undefined8 *)((long)(__dest + -1) + 0x78) = *(undefined8 *)((long)arg2 + 0x3df4);
            *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar10;
            *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar8;
            *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar9;
            __src = (void *)((long)arg2 + 0x7748);
          }
          else if (uVar33 == 1) {
            uVar8 = *(undefined8 *)((long)arg2 + 0x3e04);
            uVar9 = *(undefined8 *)((long)arg2 + 0x3e0c);
            uVar10 = *(undefined8 *)((long)arg2 + 0x3e1c);
            *(undefined8 *)((long)(__dest + -1) + 0x78) = *(undefined8 *)((long)arg2 + 0x3e14);
            *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar10;
            *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar8;
            *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar9;
            __src = (void *)((long)arg2 + 0x7c08);
          }
          else {
            uVar8 = *(undefined8 *)((long)arg2 + 0x3e24);
            uVar9 = *(undefined8 *)((long)arg2 + 0x3e2c);
            uVar10 = *(undefined8 *)((long)arg2 + 0x3e3c);
            *(undefined8 *)((long)(__dest + -1) + 0x78) = *(undefined8 *)((long)arg2 + 0x3e34);
            *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar10;
            *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar8;
            *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar9;
            __src = (void *)((long)arg2 + 0x80c8);
          }
          memcpy(__dest,__src,0x4c0);
          if (cVar31 != '\0') break;
          __dest = (qm_val_t *(*) [19])((long)(__dest + 0x11) + 0x18);
          bVar43 = uVar33 < 2;
          uVar33 = uVar33 + 1;
        } while (bVar43);
        lVar30 = lVar30 + (long)iVar22 * (long)iVar25 * 0x53a0;
        lVar41 = (long)iVar19 * 0x53a0;
        tile = (TileInfo *)(lVar41 + lVar30);
        (td->dcb).xd.mi_stride = *(int *)((long)arg2 + 0x3da4);
        (td->dcb).xd.error_info = *(aom_internal_error_info **)((long)arg2 + 0x3b90);
        cfl_init(&(td->dcb).xd.cfl,*(SequenceHeader **)((long)arg2 + 0x9be8));
        (td->dcb).xd.error_info = (aom_internal_error_info *)((long)arg1 + 0x10);
        cVar31 = *(char *)(*(long *)((long)arg2 + 0x9be8) + 0x4d);
        lVar39 = *(long *)((long)arg2 + 0x48d20);
        iVar25 = *(int *)(lVar41 + 0x10 + lVar30);
        iVar19 = *(int *)((long)arg2 + 0x9c00);
        iVar22 = *(int *)(lVar41 + 0x14 + lVar30);
        iVar23 = av1_get_sb_cols_in_tile(cm_00,tile);
        iVar17 = *(int *)(lVar41 + 8 + lVar30);
        if (iVar17 < *(int *)(lVar41 + 0xc + lVar30)) {
          iVar35 = iVar16 - tile->mi_row_start >>
                   (*(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24) & 0x1f);
          lVar30 = (long)iVar22 * 0x53a0 + lVar39 + (long)iVar19 * (long)iVar25 * 0x53a0;
          plVar40 = (long *)(lVar30 + 0x5360);
          lVar39 = (long)(iVar35 + -1);
          lVar41 = (long)iVar35;
          uVar18 = 0;
          do {
            bVar15 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24);
            lVar26 = (long)((iVar17 >> (bVar15 & 0x1f)) +
                           (iVar16 >> (bVar15 & 0x1f)) *
                           ((*(int *)((long)arg2 + 0x3d78) >> (bVar15 & 0x1f)) + 1)) * 0x3b000;
            lVar42 = *(long *)((long)arg2 + 0x5f6d0) + lVar26;
            lVar28 = *(long *)((long)arg2 + 0x5f6d0) + lVar26 + 0x30000;
            lVar34 = 0x1d90;
            lVar26 = lVar42;
            do {
              *(long *)((long)td + lVar34 * 8 + -0xb198) = lVar26;
              *(long *)((long)td + lVar34 * 8 + -0xb178) = lVar28;
              *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -3) + lVar34 * 2) = 0;
              *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -2) + lVar34 * 2) = 0;
              lVar1 = (-(ulong)(cVar31 != '\0') | 0xfffffffffffffffd) + lVar34;
              lVar34 = lVar34 + 1;
              lVar28 = lVar28 + 0x1000;
              lVar26 = lVar26 + 0x10000;
            } while (lVar1 != 0x1d8f);
            (td->dcb).xd.plane[0].color_index_map = (uint8_t *)(lVar42 + 0x33000);
            (td->dcb).xd.plane[1].color_index_map = (uint8_t *)(lVar42 + 0x37000);
            (td->dcb).xd.color_index_map_offset[0] = 0;
            (td->dcb).xd.color_index_map_offset[1] = 0;
            if ((iVar35 != 0) &&
               (iVar25 = *(int *)(lVar30 + 0x5380), (iVar25 + 0x7fffffffU & uVar18) == 0)) {
              ppVar36 = (pthread_mutex_t *)(lVar39 * 0x28 + *plVar40);
              pthread_mutex_lock(ppVar36);
              while (*(int *)(*(long *)(lVar30 + 0x5378) + lVar39 * 4) -
                     (*(int *)(lVar30 + 0x5384) + iVar25) < (int)uVar18) {
                pthread_cond_wait((pthread_cond_t *)(lVar39 * 0x30 + *(long *)(lVar30 + 0x5368)),
                                  ppVar36);
              }
              pthread_mutex_unlock(ppVar36);
            }
            pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            iVar25 = *(int *)((long)arg2 + 0x5f714);
            pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            if (iVar25 == 0) {
              decode_partition((AV1Decoder *)arg2,td,iVar16,iVar17,td->bit_reader,
                               *(BLOCK_SIZE *)(*(long *)((long)arg2 + 0x9be8) + 0x1c),2);
            }
            uVar29 = uVar18;
            if (iVar23 + -1 <= (int)uVar18) {
              uVar29 = *(int *)(lVar30 + 0x5380) + iVar23 + *(int *)(lVar30 + 0x5384);
            }
            if (iVar23 + -1 <= (int)uVar18 || (int)uVar18 % *(int *)(lVar30 + 0x5380) == 0) {
              pthread_mutex_lock((pthread_mutex_t *)(*plVar40 + lVar41 * 0x28));
              *(uint *)(*(long *)(lVar30 + 0x5378) + lVar41 * 4) = uVar29;
              pthread_cond_signal((pthread_cond_t *)(lVar41 * 0x30 + *(long *)(lVar30 + 0x5368)));
              pthread_mutex_unlock((pthread_mutex_t *)(lVar41 * 0x28 + *plVar40));
            }
            iVar17 = iVar17 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20);
            uVar18 = uVar18 + 1;
          } while (iVar17 < tile->mi_col_end);
        }
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        tile[0x37b].tile_row = tile[0x37b].tile_row + -1;
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      } while( true );
    }
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg2 + 0x5f714) = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
    ppVar36 = *(pthread_mutex_t **)((long)arg2 + 0x5f6e0);
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    *(undefined4 *)(*arg1 + 0x3ad0) = 1;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg2 + 0x5f714) = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    piVar7 = *arg1;
    iVar16 = *piVar7;
    iVar25 = piVar7[0x7a8];
    bVar15 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24);
    iVar17 = av1_get_sb_cols_in_tile
                       ((AV1_COMMON *)((long)arg2 + 0x3b60),(TileInfo *)(piVar7 + 0x7a8));
    lVar41 = (long)*(int *)((long)arg2 + 0x9c00) * (long)piVar7[0x7ac] * 0x53a0 +
             *(long *)((long)arg2 + 0x48d20);
    lVar30 = (long)piVar7[0x7ad] * 0x53a0;
    iVar19 = *(int *)(lVar30 + 0x5380 + lVar41);
    iVar22 = *(int *)(lVar30 + 0x5384 + lVar41);
    lVar39 = (long)(iVar16 - iVar25 >> (bVar15 & 0x1f));
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)(lVar30 + 0x5360 + lVar41) + lVar39 * 0x28));
    *(int *)(*(long *)(lVar30 + 0x5378 + lVar41) + lVar39 * 4) = iVar17 + iVar19 + iVar22;
    pthread_cond_signal((pthread_cond_t *)(lVar39 * 0x30 + *(long *)(lVar30 + 0x5368 + lVar41)));
    ppVar36 = (pthread_mutex_t *)(lVar39 * 0x28 + *(long *)(lVar30 + 0x5360 + lVar41));
  }
  pthread_mutex_unlock(ppVar36);
  return 0;
}

Assistant:

static int row_mt_worker_hook(void *arg1, void *arg2) {
  DecWorkerData *const thread_data = (DecWorkerData *)arg1;
  AV1Decoder *const pbi = (AV1Decoder *)arg2;
  ThreadData *const td = thread_data->td;
  uint8_t allow_update_cdf;
  AV1DecRowMTInfo *frame_row_mt_info = &pbi->frame_row_mt_info;
  td->dcb.corrupted = 0;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(thread_data->error_info.jmp)) {
    thread_data->error_info.setjmp = 0;
    thread_data->td->dcb.corrupted = 1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    // If any SB row (erroneous row) processed by a thread encounters an
    // internal error, there is a need to indicate other threads that decoding
    // of the erroneous row is complete. This ensures that other threads which
    // wait upon the completion of SB's present in erroneous row are not waiting
    // indefinitely.
    signal_decoding_done_for_erroneous_row(pbi, &thread_data->td->dcb.xd);
    return 0;
  }
  thread_data->error_info.setjmp = 1;

  AV1_COMMON *cm = &pbi->common;
  allow_update_cdf = cm->tiles.large_scale ? 0 : 1;
  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  set_decode_func_pointers(td, 0x1);

  assert(cm->tiles.cols > 0);
  while (!td->dcb.corrupted) {
    TileJobsDec *cur_job_info = get_dec_job_info(&pbi->tile_mt_info);

    if (cur_job_info != NULL) {
      const TileBufferDec *const tile_buffer = cur_job_info->tile_buffer;
      TileDataDec *const tile_data = cur_job_info->tile_data;
      tile_worker_hook_init(pbi, thread_data, tile_buffer, tile_data,
                            allow_update_cdf);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working++;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
      // decode tile
      parse_tile_row_mt(pbi, td, tile_data);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working--;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    } else {
      break;
    }
  }

  if (td->dcb.corrupted) {
    thread_data->error_info.setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    return 0;
  }

  set_decode_func_pointers(td, 0x2);

  while (1) {
    AV1DecRowMTJobInfo next_job_info;
    int end_of_frame = 0;

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    while (!get_next_job_info(pbi, &next_job_info, &end_of_frame)) {
#if CONFIG_MULTITHREAD
      pthread_cond_wait(pbi->row_mt_cond_, pbi->row_mt_mutex_);
#endif
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif

    if (end_of_frame) break;

    int tile_row = next_job_info.tile_row;
    int tile_col = next_job_info.tile_col;
    int mi_row = next_job_info.mi_row;

    TileDataDec *tile_data =
        pbi->tile_data + tile_row * cm->tiles.cols + tile_col;
    AV1DecRowMTSync *dec_row_mt_sync = &tile_data->dec_row_mt_sync;

    av1_tile_init(&td->dcb.xd.tile, cm, tile_row, tile_col);
    av1_init_macroblockd(cm, &td->dcb.xd);
    td->dcb.xd.error_info = &thread_data->error_info;

    decode_tile_sb_row(pbi, td, &tile_data->tile_info, mi_row);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    dec_row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
  }
  thread_data->error_info.setjmp = 0;
  return !td->dcb.corrupted;
}